

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall GlobOptBlockData::SetChangedSym(GlobOptBlockData *this,Sym *sym)

{
  if (((sym != (Sym *)0x0) && (sym->m_kind == SymKindStack)) &&
     (((ulong)sym[1]._vptr_Sym & 0x2000) != 0)) {
    SetChangedSym(this,sym->m_id);
    return;
  }
  return;
}

Assistant:

void
GlobOptBlockData::SetChangedSym(Sym* sym)
{
    if (sym && sym->IsStackSym() && sym->AsStackSym()->HasByteCodeRegSlot())
    {
        SetChangedSym(sym->m_id);
    }
}